

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesture.cpp
# Opt level: O0

QPointF __thiscall QGestureEvent::mapToGraphicsScene(QGestureEvent *this,QPointF *gesturePoint)

{
  QWidget *point;
  QWidget *this_00;
  QGraphicsView *in_RSI;
  QGestureEvent *in_RDI;
  long in_FS_OFFSET;
  QGraphicsView *view;
  QWidget *w;
  QWidget *this_01;
  QPointF local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  point = widget(in_RDI);
  if (point != (QWidget *)0x0) {
    point = QWidget::parentWidget((QWidget *)0x2fcac1);
  }
  this_00 = (QWidget *)qobject_cast<QGraphicsView*>((QObject *)0x2fcad0);
  if (this_00 == (QWidget *)0x0) {
    QPointF::QPointF(&local_18);
  }
  else {
    this_01 = this_00;
    QPointF::toPoint((QPointF *)this_00);
    QWidget::mapFromGlobal(this_01,(QPoint *)this_00);
    local_18 = QGraphicsView::mapToScene(in_RSI,(QPoint *)point);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_18;
  }
  __stack_chk_fail();
}

Assistant:

QPointF QGestureEvent::mapToGraphicsScene(const QPointF &gesturePoint) const
{
    QWidget *w = widget();
    if (w) // we get the viewport as widget, not the graphics view
        w = w->parentWidget();
    QGraphicsView *view = qobject_cast<QGraphicsView*>(w);
    if (view) {
        return view->mapToScene(view->mapFromGlobal(gesturePoint.toPoint()));
    }
    return QPointF();
}